

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createCommonEdgeTests(TestContext *testCtx)

{
  TessPrimitiveType TVar1;
  CaseDefinition_conflict arg0;
  TestCaseGroup *pTVar2;
  CaseType caseType_00;
  code *in_R8;
  allocator<char> local_99;
  string local_98;
  string local_78;
  TessPrimitiveType local_54;
  CaseType CStack_50;
  CaseDefinition_conflict caseDef;
  SpacingMode spacingMode;
  CaseType caseType;
  TessPrimitiveType primitiveType;
  int spacingModeNdx;
  int caseTypeNdx;
  int primitiveTypeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&caseTypeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  for (spacingModeNdx = 0; spacingModeNdx < 2; spacingModeNdx = spacingModeNdx + 1) {
    for (primitiveType = TESSPRIMITIVETYPE_TRIANGLES; (int)primitiveType < 2;
        primitiveType = primitiveType + TESSPRIMITIVETYPE_QUADS) {
      for (caseType = CASETYPE_BASIC; caseType_00 = (CaseType)in_R8, (int)caseType < 3;
          caseType = caseType + CASETYPE_PRECISE) {
        TVar1 = createCommonEdgeTests::primitiveTypes[spacingModeNdx];
        caseDef.caseType = primitiveType;
        caseDef.spacingMode = caseType;
        CStack_50 = caseType;
        caseDef.primitiveType = primitiveType;
        local_54 = TVar1;
        pTVar2 = de::details::
                 UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                           ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             *)local_20);
        (anonymous_namespace)::getCaseName_abi_cxx11_
                  (&local_78,(_anonymous_namespace_ *)(ulong)TVar1,caseDef.spacingMode,
                   caseDef.caseType,caseType_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
        arg0.spacingMode = CStack_50;
        arg0.primitiveType = local_54;
        in_R8 = anon_unknown_2::test;
        arg0.caseType = caseDef.primitiveType;
        addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                  (pTVar2,&local_78,&local_98,anon_unknown_2::initPrograms,anon_unknown_2::test,arg0
                  );
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createCommonEdgeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them"));

	static const TessPrimitiveType primitiveTypes[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	for (int caseTypeNdx = 0; caseTypeNdx < CASETYPE_LAST; ++caseTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitiveTypes[primitiveTypeNdx];
		const CaseType			caseType	  = static_cast<CaseType>(caseTypeNdx);
		const SpacingMode		spacingMode   = static_cast<SpacingMode>(spacingModeNdx);
		const CaseDefinition	caseDef		  = { primitiveType, spacingMode, caseType };

		addFunctionCaseWithPrograms(group.get(), getCaseName(primitiveType, spacingMode, caseType), "", initPrograms, test, caseDef);
	}

	return group.release();
}